

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_SurfaceCurvature __thiscall
ON_SubDMeshFragment::CornerCurvature(ON_SubDMeshFragment *this,uint grid_corner_index)

{
  uint uVar1;
  uint *puVar2;
  ON_SurfaceCurvature *pOVar3;
  
  pOVar3 = &ON_SurfaceCurvature::Nan;
  if ((((grid_corner_index < 4) && (puVar2 = (this->m_grid).m_S, puVar2 != (uint *)0x0)) &&
      ((this->m_vertex_capacity_etc & 0x4000) != 0)) &&
     (((this->m_K != (ON_SurfaceCurvature *)0x0 && (this->m_K_stride != 0)) &&
      (uVar1 = puVar2[(this->m_grid).m_side_segment_count * grid_corner_index],
      uVar1 < (this->m_vertex_count_etc & 0x1fff))))) {
    pOVar3 = this->m_K + uVar1;
  }
  return *pOVar3;
}

Assistant:

const ON_SurfaceCurvature ON_SubDMeshFragment::CornerCurvature(unsigned int grid_corner_index) const
{
  for (;;)
  {
    if (grid_corner_index >= 4 || nullptr == m_grid.m_S)
      break;

    const unsigned n = this->CurvatureCount();
    const unsigned int i = m_grid.m_S[grid_corner_index * m_grid.m_side_segment_count];
    if (i >= n)
      break;

    return m_K[i];
  }
  return ON_SurfaceCurvature::Nan;
}